

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O3

bool slang::ast::formatSpecialArg(char spec,Scope *scope,string *result)

{
  uint uVar1;
  SourceLibrary *pSVar2;
  DefinitionSymbol *pDVar3;
  undefined7 in_register_00000039;
  
  uVar1 = tolower((int)CONCAT71(in_register_00000039,spec));
  if ((char)uVar1 == 'm') {
    Symbol::appendHierarchicalPath((Symbol *)scope,result);
  }
  else {
    if ((uVar1 & 0xff) != 0x6c) {
      return false;
    }
    pSVar2 = Symbol::getSourceLibrary((Symbol *)scope);
    if (pSVar2 != (SourceLibrary *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (result,(pSVar2->name)._M_dataplus._M_p,(pSVar2->name)._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (result,'.');
    }
    pDVar3 = Symbol::getDeclaringDefinition((Symbol *)scope);
    if (pDVar3 == (DefinitionSymbol *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (result,"$unit");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (result,(pDVar3->super_Symbol).name._M_str,(pDVar3->super_Symbol).name._M_len);
    }
  }
  return true;
}

Assistant:

static bool formatSpecialArg(char spec, const Scope& scope, std::string& result) {
    switch (charToLower(spec)) {
        case 'l': {
            auto& sym = scope.asSymbol();
            if (auto lib = sym.getSourceLibrary()) {
                result += lib->name;
                result.push_back('.');
            }
            if (auto def = sym.getDeclaringDefinition())
                result += def->name;
            else
                result += "$unit";
            return true;
        }
        case 'm':
            scope.asSymbol().appendHierarchicalPath(result);
            return true;
        default:
            return false;
    }
}